

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O3

int stumpless_trace_entry
              (stumpless_target *target,stumpless_entry *entry,char *file,int line,char *func)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  char *pcVar5;
  char digits [50];
  char local_38 [16];
  
  if (entry == (stumpless_entry *)0x0) {
    pcVar5 = "entry was NULL";
  }
  else if (file == (char *)0x0) {
    pcVar5 = "file was NULL";
  }
  else {
    if (func != (char *)0x0) {
      local_38[1] = 0;
      if (line == 0) {
        pcVar5 = local_38;
        local_38[0] = '0';
      }
      else {
        pcVar3 = local_38 + 1;
        do {
          pcVar5 = pcVar3 + -1;
          pcVar3[-1] = (char)line + (char)(line / 10) * -10 + '0';
          uVar4 = line + 9;
          pcVar3 = pcVar5;
          line = line / 10;
        } while (0x12 < uVar4);
      }
      stumpless_set_entry_param_value_by_name(entry,"trace","file",file);
      _Var1 = stumpless_has_error();
      if (_Var1) {
        return -1;
      }
      stumpless_set_entry_param_value_by_name(entry,"trace","line",pcVar5);
      _Var1 = stumpless_has_error();
      if (_Var1) {
        return -1;
      }
      stumpless_set_entry_param_value_by_name(entry,"trace","function",func);
      _Var1 = stumpless_has_error();
      if (_Var1) {
        return -1;
      }
      iVar2 = stumpless_add_entry(target,entry);
      return iVar2;
    }
    pcVar5 = "func was NULL";
  }
  raise_argument_empty(pcVar5);
  return -1;
}

Assistant:

int
stumpless_trace_entry( struct stumpless_target *target,
                       struct stumpless_entry *entry,
                       const char *file,
                       int line,
                       const char *func ) {
  char digits[MAX_INT_SIZE];
  char *line_str;

  VALIDATE_ARG_NOT_NULL_INT_RETURN( entry );
  VALIDATE_ARG_NOT_NULL_INT_RETURN( file );
  VALIDATE_ARG_NOT_NULL_INT_RETURN( func );

  digits[MAX_INT_SIZE-1] = '\0';
  line_str = digits + MAX_INT_SIZE - 1;
  if( line == 0 ) {
    line_str--;
    *line_str = '0';
  } else {
    while( line != 0 ) {
      line_str--;
      *line_str = ( line % 10 ) + 48;
      line /= 10;
    }
  }

  stumpless_set_entry_param_value_by_name( entry, "trace", "file", file );
  if( unlikely( stumpless_has_error(  ) ) ) {
    return -1;
  }

  stumpless_set_entry_param_value_by_name( entry, "trace", "line", line_str );
  if( unlikely( stumpless_has_error(  ) ) ) {
    return -1;
  }

  stumpless_set_entry_param_value_by_name( entry, "trace", "function", func );
  if( unlikely( stumpless_has_error(  ) ) ) {
    return -1;
  }

  return stumpless_add_entry( target, entry );
}